

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

char * stumpless_get_target_name(stumpless_target *target)

{
  char *name_copy;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    lock_target(target);
    target_local = (stumpless_target *)alloc_mem(target->name_length + 1);
    if (target_local != (stumpless_target *)0x0) {
      memcpy(target_local,target->name,target->name_length + 1);
      clear_error();
    }
    unlock_target(target);
  }
  return (char *)target_local;
}

Assistant:

const char *
stumpless_get_target_name( const struct stumpless_target *target ) {
  char *name_copy;

  VALIDATE_ARG_NOT_NULL( target );

  lock_target( target );
  name_copy = alloc_mem( target->name_length + 1 );
  if( !name_copy ) {
    goto cleanup_and_return;
  }
  memcpy( name_copy, target->name, target->name_length + 1 );
  clear_error(  );

cleanup_and_return:
  unlock_target( target );
  return name_copy;
}